

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobHashTable.h
# Opt level: O0

void __thiscall ValueHashTable<Sym_*,_Value_*>::Clear(ValueHashTable<Sym_*,_Value_*> *this,uint key)

{
  DictionaryStats *this_00;
  bool bVar1;
  uint uVar2;
  Type *pTVar3;
  byte local_51;
  HashBucket *bucket;
  EditingIterator iter;
  bool first;
  SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount> *list;
  uint hash;
  uint key_local;
  ValueHashTable<Sym_*,_Value_*> *this_local;
  
  uVar2 = Hash(this,key);
  iter.last._7_1_ = 1;
  SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount>::GetEditingIterator
            ((EditingIterator *)&bucket,this->table + uVar2);
  while( true ) {
    bVar1 = SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount>::
            EditingIterator::Next((EditingIterator *)&bucket);
    if (!bVar1) {
      return;
    }
    pTVar3 = SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount>::Iterator::
             Data((Iterator *)&bucket);
    uVar2 = ::Key::Get(pTVar3->value);
    if (uVar2 <= key) break;
    iter.last._7_1_ = 0;
  }
  uVar2 = ::Key::Get(pTVar3->value);
  if (uVar2 != key) {
    return;
  }
  SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount>::EditingIterator::
  RemoveCurrent((EditingIterator *)&bucket,&this->alloc->super_ArenaAllocator);
  if (this->stats == (DictionaryStats *)0x0) {
    return;
  }
  this_00 = this->stats;
  local_51 = 0;
  if ((iter.last._7_1_ & 1) != 0) {
    bVar1 = SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount>::
            EditingIterator::Next((EditingIterator *)&bucket);
    local_51 = bVar1 ^ 0xff;
  }
  DictionaryStats::Remove(this_00,(bool)(local_51 & 1));
  return;
}

Assistant:

void Clear(uint key)
    {
        uint hash = this->Hash(key);
        SListBase<HashBucket> * list = &this->table[hash];

        // Assumes sorted lists
#if PROFILE_DICTIONARY
        bool first = true;
#endif
        FOREACH_SLISTBASE_ENTRY_EDITING(HashBucket, bucket, list, iter)
        {
            if (Key::Get(bucket.value) <= key)
            {
                if (Key::Get(bucket.value) == key)
                {
                    iter.RemoveCurrent(this->alloc);
#if PROFILE_DICTIONARY
                    if (stats)
                        stats->Remove(first && !(iter.Next()));
#endif
                }
                return;
            }
#if PROFILE_DICTIONARY
        first = false;
#endif
        } NEXT_SLISTBASE_ENTRY_EDITING;
    }